

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O1

int64_t number_from_oct(char *s,uint32_t len)

{
  longlong lVar1;
  
  if (0x18 < len) {
    return 0;
  }
  lVar1 = strtoll(s,(char **)0x0,8);
  return lVar1;
}

Assistant:

int64_t number_from_oct (const char *s, uint32_t len) {
    // LLONG_MIN  = -9223372036854775808
    // LLONG_MAX  = +9223372036854775807
    // OCT(9223372036854775808) = 32155613530704145
    
    // sanity check on len in order to workaround an address sanitizer error
    if (len > 24) return 0;
    return (int64_t) strtoll(s, NULL, 8);
}